

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int xmlBufGrow(xmlBufPtr buf,int len)

{
  size_t sVar1;
  size_t ret;
  int len_local;
  xmlBufPtr buf_local;
  
  if ((buf == (xmlBufPtr)0x0) || (len < 0)) {
    buf_local._4_4_ = -1;
  }
  else if (len == 0) {
    buf_local._4_4_ = 0;
  }
  else {
    sVar1 = xmlBufGrowInternal(buf,(long)len);
    if (buf->error == 0) {
      buf_local._4_4_ = (int)sVar1;
    }
    else {
      buf_local._4_4_ = -1;
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufGrow(xmlBufPtr buf, int len) {
    size_t ret;

    if ((buf == NULL) || (len < 0)) return(-1);
    if (len == 0)
        return(0);
    ret = xmlBufGrowInternal(buf, len);
    if (buf->error != 0)
        return(-1);
    return((int) ret);
}